

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O1

void __thiscall
absl::Flag<unsigned_long>::Flag
          (Flag<unsigned_long> *this,char *name,char *type,char *help,unsigned_long *default_value)

{
  element_type *peVar1;
  FlagFunc *__p;
  shared_ptr<absl::internal::FlagFunc> local_1d8;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  this->_vptr_Flag = (_func_int **)&PTR__Flag_00381670;
  this->value_ = *default_value;
  __p = (FlagFunc *)operator_new(0x58);
  (__p->default_value)._M_dataplus._M_p = (pointer)&(__p->default_value).field_2;
  (__p->default_value)._M_string_length = 0;
  (__p->default_value).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(__p->set_value).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__p->set_value).super__Function_base._M_functor + 8) = 0;
  (__p->set_value).super__Function_base._M_manager = (_Manager_type)0x0;
  (__p->set_value)._M_invoker = (_Invoker_type)0x0;
  (this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<absl::internal::FlagFunc*>
            (&(this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  peVar1 = (this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->name = name;
  peVar1->help = help;
  peVar1->type = type;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::string::operator=
            ((string *)
             &((this->func_).
               super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              default_value,(string *)local_1c8);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  local_1a8._0_8_ = this;
  std::function<void(std::__cxx11::string_const&)>::operator=
            ((function<void(std::__cxx11::string_const&)> *)
             &((this->func_).
               super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              set_value,(anon_class_8_1_8991fb9c *)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,name,(allocator<char> *)local_1c8);
  local_1d8.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_1d8.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (this->func_).super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_1d8.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1d8.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_1d8.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1d8.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_1d8.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  internal::RegisterFlag((string *)local_1a8,&local_1d8);
  if (local_1d8.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d8.super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((Flag<unsigned_long> *)local_1a8._0_8_ != (Flag<unsigned_long> *)(local_1a8 + 0x10)) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  return;
}

Assistant:

Flag<T>::Flag(const char *name, const char *type, const char *help,
              const T &default_value)
    : value_(default_value), func_(new internal::FlagFunc) {
  func_->name = name;
  func_->help = help;
  func_->type = type;
  func_->default_value = internal::to_str<T>(default_value);
  func_->set_value = [this](const std::string &value) {
    this->set_value_as_str(value);
  };
  RegisterFlag(name, func_);
}